

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O0

void __thiscall HashTable<int>::diaplay(HashTable<int> *this)

{
  ostream *poVar1;
  Node *local_20;
  Node *p;
  int i;
  HashTable<int> *this_local;
  
  for (p._4_4_ = 0; p._4_4_ < 0x14; p._4_4_ = p._4_4_ + 1) {
    if (this->HashArray[p._4_4_].key != 9999999) {
      poVar1 = std::operator<<((ostream *)&std::cout,"key:");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->HashArray[p._4_4_].key);
      poVar1 = std::operator<<(poVar1,"\tvalue:");
      std::ostream::operator<<(poVar1,this->HashArray[p._4_4_].value);
      local_20 = this->HashArray + p._4_4_;
      while (local_20->next != (node *)0x0) {
        local_20 = local_20->next;
        poVar1 = std::operator<<((ostream *)&std::cout,"\tkey:");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->key);
        poVar1 = std::operator<<(poVar1,"\tvalue:");
        std::ostream::operator<<(poVar1,local_20->value);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void diaplay() {
		for (int i = 0; i < 20; i++) {
			if (HashArray[i].key != MyNull) {
				cout <<"key:"<< HashArray[i].key << "	value:" << HashArray[i].value;
				Node *p = &HashArray[i];
				while (p->next != NULL) {
					p = p->next;
					cout <<"	key:"<< p->key << "	value:" << p->value;
				}
				cout << endl;
			}
		}
	}